

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

errr finish_parse_quest(parser *p)

{
  undefined8 *puVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  quest **ppqVar8;
  angband_constants *paVar9;
  quest *pqVar10;
  undefined8 *puVar11;
  uint16_t uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  z_info->quest_max = 0;
  puVar11 = (undefined8 *)parser_priv(p);
  paVar9 = z_info;
  uVar12 = z_info->quest_max;
  for (; puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
    uVar12 = uVar12 + 1;
    paVar9->quest_max = uVar12;
  }
  quests = (quest *)mem_zalloc((ulong)uVar12 * 0x30);
  uVar2 = z_info->quest_max;
  puVar11 = (undefined8 *)parser_priv(p);
  lVar15 = (ulong)uVar2 * 0x30;
  uVar14 = (ulong)uVar2;
  while (pqVar10 = quests, puVar11 != (undefined8 *)0x0) {
    ppqVar8 = &quests->next;
    uVar3 = puVar11[1];
    uVar4 = puVar11[2];
    uVar5 = puVar11[3];
    uVar6 = puVar11[4];
    uVar7 = puVar11[5];
    puVar1 = (undefined8 *)((long)&quests[-1].next + lVar15);
    *puVar1 = *puVar11;
    puVar1[1] = uVar3;
    puVar1 = (undefined8 *)((long)pqVar10 + lVar15 + -0x10);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)pqVar10 + lVar15 + -0x20);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    *(char *)((long)pqVar10 + lVar15 + -0x28) = (char)uVar14 + -1;
    puVar1 = (undefined8 *)*puVar11;
    lVar13 = (long)ppqVar8 + lVar15;
    if ((long)(ulong)z_info->quest_max <= (long)uVar14) {
      lVar13 = 0;
    }
    *(long *)((long)&pqVar10[-1].next + lVar15) = lVar13;
    mem_free(puVar11);
    lVar15 = lVar15 + -0x30;
    puVar11 = puVar1;
    uVar14 = uVar14 - 1;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_quest(struct parser *p) {
	struct quest *quest, *next = NULL;
	int count;

	/* Count the entries */
	z_info->quest_max = 0;
	quest = parser_priv(p);
	while (quest) {
		z_info->quest_max++;
		quest = quest->next;
	}

	/* Allocate the direct access list and copy the data to it */
	quests = mem_zalloc(z_info->quest_max * sizeof(*quest));
	count = z_info->quest_max - 1;
	for (quest = parser_priv(p); quest; quest = next, count--) {
		memcpy(&quests[count], quest, sizeof(*quest));
		quests[count].index = count;
		next = quest->next;
		if (count < z_info->quest_max - 1)
			quests[count].next = &quests[count + 1];
		else
			quests[count].next = NULL;

		mem_free(quest);
	}

	parser_destroy(p);
	return 0;
}